

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int iVar4;
  int line;
  xmlChar *name;
  int res;
  int end_in_lf;
  size_t pos;
  size_t maxLength;
  size_t curBase;
  int terminate_local;
  int size_local;
  char *chunk_local;
  xmlParserCtxtPtr ctxt_local;
  
  bVar3 = false;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (size < 0)) {
    ctxt_local._4_4_ = 0x73;
  }
  else if ((chunk == (char *)0x0) && (0 < size)) {
    ctxt_local._4_4_ = 0x73;
  }
  else if ((ctxt->input == (xmlParserInputPtr)0x0) ||
          (ctxt->input->buf == (xmlParserInputBufferPtr)0x0)) {
    ctxt_local._4_4_ = 0x73;
  }
  else if (ctxt->disableSAX == 0) {
    ctxt->input->flags = ctxt->input->flags | 0x40;
    if (ctxt->instate == XML_PARSER_START) {
      xmlCtxtInitializeLate(ctxt);
    }
    curBase._4_4_ = size;
    if ((((0 < size) && (chunk != (char *)0x0)) && (terminate == 0)) && (chunk[size + -1] == '\r'))
    {
      bVar3 = true;
      curBase._4_4_ = size + -1;
    }
    pxVar1 = ctxt->input->cur;
    pxVar2 = ctxt->input->base;
    iVar4 = xmlParserInputBufferPush(ctxt->input->buf,curBase._4_4_,chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar1 - (long)pxVar2);
    if (iVar4 < 0) {
      xmlCtxtErrIO(ctxt,ctxt->input->buf->error,(char *)0x0);
      xmlHaltParser(ctxt);
      ctxt_local._4_4_ = ctxt->errNo;
    }
    else {
      xmlParseTryOrFinish(ctxt,terminate);
      iVar4 = 10000000;
      if ((ctxt->options & 0x80000U) != 0) {
        iVar4 = 1000000000;
      }
      if ((ulong)(long)iVar4 < (ulong)((long)ctxt->input->cur - (long)ctxt->input->base)) {
        xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
      }
      if ((ctxt->errNo == 0) || (ctxt->disableSAX == 0)) {
        if (bVar3) {
          pxVar1 = ctxt->input->cur;
          pxVar2 = ctxt->input->base;
          iVar4 = xmlParserInputBufferPush(ctxt->input->buf,1,"\r");
          xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar1 - (long)pxVar2);
          if (iVar4 < 0) {
            xmlCtxtErrIO(ctxt,ctxt->input->buf->error,(char *)0x0);
            xmlHaltParser(ctxt);
            return ctxt->errNo;
          }
        }
        if (terminate != 0) {
          if ((ctxt->instate == XML_PARSER_EOF) || (ctxt->instate == XML_PARSER_EPILOG)) {
            if ((ctxt->input->buf->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
               ((ctxt->input->buf->error == 0 &&
                (iVar4 = xmlBufIsEmpty(ctxt->input->buf->raw), iVar4 == 0)))) {
              xmlFatalErrMsg(ctxt,XML_ERR_INVALID_CHAR,"Truncated multi-byte sequence at EOF\n");
            }
          }
          else if (ctxt->nameNr < 1) {
            if (ctxt->instate == XML_PARSER_START) {
              xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
            }
            else {
              xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
            }
          }
          else {
            xmlFatalErrMsgStrIntStr
                      (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
                       ctxt->nameTab[ctxt->nameNr + -1],ctxt->pushTab[ctxt->nameNr + -1].line,
                       (xmlChar *)0x0);
          }
          if (ctxt->instate != XML_PARSER_EOF) {
            ctxt->instate = XML_PARSER_EOF;
            xmlFinishDocument(ctxt);
          }
        }
        if (ctxt->wellFormed == 0) {
          ctxt_local._4_4_ = ctxt->errNo;
        }
        else {
          ctxt_local._4_4_ = 0;
        }
      }
      else {
        ctxt_local._4_4_ = ctxt->errNo;
      }
    }
  }
  else {
    ctxt_local._4_4_ = ctxt->errNo;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    size_t curBase;
    size_t maxLength;
    size_t pos;
    int end_in_lf = 0;
    int res;

    if ((ctxt == NULL) || (size < 0))
        return(XML_ERR_ARGUMENT);
    if ((chunk == NULL) && (size > 0))
        return(XML_ERR_ARGUMENT);
    if ((ctxt->input == NULL) || (ctxt->input->buf == NULL))
        return(XML_ERR_ARGUMENT);
    if (ctxt->disableSAX != 0)
        return(ctxt->errNo);

    ctxt->input->flags |= XML_INPUT_PROGRESSIVE;
    if (ctxt->instate == XML_PARSER_START)
        xmlCtxtInitializeLate(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

    /*
     * Also push an empty chunk to make sure that the raw buffer
     * will be flushed if there is an encoder.
     */
    pos = ctxt->input->cur - ctxt->input->base;
    res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
    if (res < 0) {
        xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
        xmlHaltParser(ctxt);
        return(ctxt->errNo);
    }

    xmlParseTryOrFinish(ctxt, terminate);

    curBase = ctxt->input->cur - ctxt->input->base;
    maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                XML_MAX_HUGE_LENGTH :
                XML_MAX_LOOKUP_LIMIT;
    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
    }

    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX != 0))
        return(ctxt->errNo);

    if (end_in_lf == 1) {
	pos = ctxt->input->cur - ctxt->input->base;
	res = xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");
	xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
        if (res < 0) {
            xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
            xmlHaltParser(ctxt);
            return(ctxt->errNo);
        }
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
        if ((ctxt->instate != XML_PARSER_EOF) &&
            (ctxt->instate != XML_PARSER_EPILOG)) {
            if (ctxt->nameNr > 0) {
                const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
                int line = ctxt->pushTab[ctxt->nameNr - 1].line;
                xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                        "Premature end of data in tag %s line %d\n",
                        name, line, NULL);
            } else if (ctxt->instate == XML_PARSER_START) {
                xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
            } else {
                xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                               "Start tag expected, '<' not found\n");
            }
        } else if ((ctxt->input->buf->encoder != NULL) &&
                   (ctxt->input->buf->error == 0) &&
                   (!xmlBufIsEmpty(ctxt->input->buf->raw))) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                           "Truncated multi-byte sequence at EOF\n");
        }
	if (ctxt->instate != XML_PARSER_EOF) {
            ctxt->instate = XML_PARSER_EOF;
            xmlFinishDocument(ctxt);
	}
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}